

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition
               (sysbvm_context_t *context,sysbvm_functionDefinition_t *definition_)

{
  undefined1 auVar1 [16];
  sysbvm_functionBytecodeAssembler_t *psVar2;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar3;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar4;
  anon_struct_8_2_b06356a8_for_anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0_1 aVar5;
  undefined4 uVar6;
  _Bool _Var7;
  byte bVar8;
  byte bVar9;
  short sVar10;
  size_t i_4;
  ulong uVar11;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar12;
  size_t sVar13;
  sysbvm_tuple_t sVar14;
  ulong uVar15;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t **ppsVar16;
  short sVar17;
  sysbvm_tuple_t sVar18;
  undefined8 uVar19;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar20;
  ulong uVar21;
  size_t i;
  size_t sVar22;
  long lVar23;
  sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand;
  undefined2 *puVar24;
  sysbvm_size_t sVar25;
  size_t i_3;
  ulong uVar26;
  size_t i_2;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar27;
  uint uVar28;
  sysbvm_functionBytecodeAssemblerInstruction_t *bytecodeInstruction;
  long lVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  sysbvm_functionDefinition_t *local_c8;
  sysbvm_tuple_t local_c0;
  sysbvm_functionBytecodeDirectCompiler_t *psStack_b8;
  sysbvm_tuple_t local_b0;
  sysbvm_object_tuple_t *psStack_a8;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *local_a0;
  sysbvm_tuple_t sStack_98;
  sysbvm_tuple_t local_90;
  long local_88;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *local_80;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t **local_78;
  long local_70;
  long local_68;
  long local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_functionDefinition_t **local_40;
  
  local_40 = &local_c8;
  local_a0 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0;
  sStack_98 = 0;
  local_b0 = 0;
  psStack_a8 = (sysbvm_object_tuple_t *)0x0;
  local_c0 = 0;
  psStack_b8 = (sysbvm_functionBytecodeDirectCompiler_t *)0x0;
  local_90 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 8;
  local_c8 = definition_;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_c0 = local_c8->sourceAnalyzedDefinition;
  psStack_b8 = (sysbvm_functionBytecodeDirectCompiler_t *)
               sysbvm_functionBytecodeDirectCompiler_create(context);
  psVar2 = psStack_b8->assembler;
  sVar14 = *(sysbvm_tuple_t *)(local_c0 + 0x18);
  psVar2->sourcePosition = *(sysbvm_tuple_t *)(local_c0 + 0x10);
  psVar2->sourceEnvironment = sVar14;
  uVar11 = *(ulong *)(local_c0 + 0x28);
  if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
    sVar13 = (size_t)(*(uint *)(uVar11 + 0xc) >> 3);
  }
  else {
    sVar13 = 0;
  }
  sysbvm_functionBytecodeAssembler_setArgumentCount(context,psVar2,sVar13);
  for (sVar22 = 0; sVar13 != sVar22; sVar22 = sVar22 + 1) {
    uVar11 = *(ulong *)(local_c0 + 0x28);
    if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
      sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10 + sVar22 * 8);
    }
    else {
      sVar14 = 0;
    }
    uVar11 = psStack_b8->assembler->arguments;
    if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
      sVar18 = *(sysbvm_tuple_t *)(uVar11 + 0x10 + sVar22 * 8);
    }
    else {
      sVar18 = 0;
    }
    sysbvm_functionBytecodeDirectCompiler_setBindingValue(context,psStack_b8,sVar14,sVar18);
  }
  uVar11 = *(ulong *)(local_c0 + 0x20);
  if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
    sVar13 = (size_t)(*(uint *)(uVar11 + 0xc) >> 3);
  }
  else {
    sVar13 = 0;
  }
  sysbvm_functionBytecodeAssembler_setCaptureCount(context,psStack_b8->assembler,sVar13);
  for (sVar22 = 0; sVar13 != sVar22; sVar22 = sVar22 + 1) {
    uVar11 = *(ulong *)(local_c0 + 0x20);
    if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
      sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10 + sVar22 * 8);
    }
    else {
      sVar14 = 0;
    }
    uVar11 = psStack_b8->assembler->captures;
    if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
      sVar18 = *(sysbvm_tuple_t *)(uVar11 + 0x10 + sVar22 * 8);
    }
    else {
      sVar18 = 0;
    }
    sysbvm_functionBytecodeDirectCompiler_setBindingValue(context,psStack_b8,sVar14,sVar18);
  }
  if (*(sysbvm_tuple_t *)(local_c0 + 0x48) == 0) {
    local_b0 = sysbvm_functionBytecodeAssembler_addLiteral(context,psStack_b8->assembler,0x2f);
  }
  else {
    local_b0 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,psStack_b8,*(sysbvm_tuple_t *)(local_c0 + 0x48));
  }
  if (local_b0 != 0) {
    sysbvm_functionBytecodeAssembler_return(context,psStack_b8->assembler,local_b0);
  }
  psVar2 = psStack_b8->assembler;
  psVar3 = psVar2->firstInstruction;
  while (psVar27 = psVar3, psVar27 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0)
  {
    psVar3 = psVar27->next;
    _Var7 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar27);
    if (((!_Var7) &&
        (uVar11 = psVar27[1].super.header.field_0.typePointer >> 4, (byte)uVar11 < 0x27)) &&
       ((0x6000020000U >> (uVar11 & 0x3f) & 1) != 0)) {
      uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
      if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
        psVar12 = *(sysbvm_functionBytecodeAssemblerAbstractInstruction_s **)
                   ((ulong)(*(uint *)(uVar11 + 0xc) & 0xfffffff8) + 8 + uVar11);
      }
      else {
        psVar12 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0;
      }
      if (psVar12 == psVar3) {
        psVar12 = psVar27->previous;
        psVar4 = psVar27->next;
        ppsVar20 = &psVar12->next;
        if (psVar12 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
          ppsVar20 = &psVar2->firstInstruction;
        }
        *ppsVar20 = psVar4;
        ppsVar20 = &psVar4->previous;
        if (psVar4 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
          ppsVar20 = &psVar2->lastInstruction;
        }
        *ppsVar20 = psVar12;
      }
    }
  }
  psVar2 = psStack_b8->assembler;
  sVar13 = sysbvm_orderedCollection_getSize(psVar2->temporaries);
  for (sVar22 = 0; sVar13 != sVar22; sVar22 = sVar22 + 1) {
    sVar14 = sysbvm_orderedCollection_at(psVar2->temporaries,sVar22);
    *(undefined8 *)(sVar14 + 0x20) = 0xf;
    *(undefined8 *)(sVar14 + 0x28) = 0xf;
    *(undefined8 *)(sVar14 + 0x30) = 0xf;
    *(undefined8 *)(sVar14 + 0x38) = 0xf;
    *(undefined8 *)(sVar14 + 0x40) = 0xf;
    *(undefined8 *)(sVar14 + 0x48) = 0xf;
  }
  ppsVar16 = &psVar2->firstInstruction;
  local_78 = ppsVar16;
  while (psVar27 = *ppsVar16,
        psVar27 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    _Var7 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar27);
    if (!_Var7) {
      uVar28 = psVar27[1].super.header.field_0.field_1.typePointer32 >> 4;
      bVar9 = (byte)uVar28;
      if (bVar9 != 0x1f) {
        bVar8 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(bVar9);
        uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
        bVar30 = (uVar11 & 0xf) != 0;
        if (bVar30 || uVar11 == 0) {
          uVar21 = 0;
        }
        else {
          uVar21 = (ulong)(*(uint *)(uVar11 + 0xc) >> 3);
        }
        if ((bVar9 < 0x27) && ((0x6000020000U >> ((ulong)(uVar28 & 0xff) & 0x3f) & 1) != 0)) {
          uVar21 = uVar21 - 1;
        }
        uVar15 = (ulong)bVar8;
        for (uVar26 = 0; uVar15 != uVar26; uVar26 = uVar26 + 1) {
          if ((!bVar30 && uVar11 != 0) &&
             (lVar23 = *(long *)(uVar11 + 0x10 + uVar26 * 8), lVar23 != 0)) {
            if ((bVar9 & 0xef) == 0x20) {
              *(undefined8 *)(lVar23 + 0x20) = 0x1f;
LAB_0014722f:
              lVar29 = 0x38;
            }
            else {
              *(undefined8 *)(lVar23 + 0x28) = 0x1f;
              lVar29 = 0x30;
              if (bVar9 != 0x37) goto LAB_0014722f;
            }
            *(undefined8 *)(lVar23 + lVar29) = 0x1f;
          }
        }
        for (; uVar15 < uVar21; uVar15 = uVar15 + 1) {
          lVar23 = (ulong)(uVar15 != 0) * 8 + 0x40;
          if (bVar9 != 0x24) {
            lVar23 = 0x48;
          }
          if (bVar9 == 0x22) {
            lVar23 = 0x40;
          }
          *(undefined8 *)(*(long *)(uVar11 + 0x10 + uVar15 * 8) + lVar23) = 0x1f;
        }
      }
    }
    ppsVar16 = &psVar27->next;
  }
  psVar3 = psVar2->firstInstruction;
LAB_0014728f:
  do {
    do {
      psVar27 = psVar3;
      if (psVar27 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
        sVar13 = sysbvm_orderedCollection_getSize(psStack_b8->assembler->temporaries);
        sVar14 = sysbvm_tuple_size_encode(context,sVar13);
        psStack_b8->assembler->usedTemporaryCount = sVar14;
        psStack_a8 = sysbvm_context_allocatePointerTuple
                               (context,(context->roots).functionBytecodeType,0x12);
        uVar11 = psStack_b8->assembler->arguments;
        if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
          sVar25 = (sysbvm_size_t)(*(uint *)(uVar11 + 0xc) >> 3);
        }
        else {
          sVar25 = 0;
        }
        sVar14 = sysbvm_tuple_size_encode(context,sVar25);
        (psStack_a8->field_1).pointers[0] = sVar14;
        uVar11 = psStack_b8->assembler->captures;
        if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
          sVar25 = (sysbvm_size_t)(*(uint *)(uVar11 + 0xc) >> 3);
        }
        else {
          sVar25 = 0;
        }
        sVar14 = sysbvm_tuple_size_encode(context,sVar25);
        psStack_a8[1].header.field_0.typePointer = sVar14;
        psVar2 = psStack_b8->assembler;
        uVar6 = *(undefined4 *)((long)&psVar2->usedTemporaryCount + 4);
        psStack_a8[1].header.identityHashAndFlags = *(undefined4 *)&psVar2->usedTemporaryCount;
        psStack_a8[1].header.objectSize = uVar6;
        sVar14 = sysbvm_orderedCollection_asArray(context,psVar2->literals);
        psStack_a8[1].field_1.pointers[0] = sVar14;
        *(sysbvm_functionDefinition_t **)&psStack_a8[2].header.identityHashAndFlags = local_c8;
        auVar1 = *(undefined1 (*) [16])(local_c0 + 0x20);
        auVar32._0_8_ = auVar1._8_8_;
        auVar32._8_4_ = auVar1._0_4_;
        auVar32._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])&psStack_a8[2].field_1 = auVar32;
        sVar14 = sysbvm_orderedCollection_asArray(context,psStack_b8->assembler->temporaryTypes);
        psStack_a8[3].header.identityHashAndFlags = (int)sVar14;
        psStack_a8[3].header.objectSize = (int)(sVar14 >> 0x20);
        psStack_a8[4].field_1.pointers[0] = 0xc;
        psStack_a8[5].header.field_0.typePointer = 0xc;
        psStack_a8[5].header.identityHashAndFlags = 0xc;
        psStack_a8[5].header.objectSize = 0;
        psStack_a8[5].field_1.pointers[0] = 0xc;
        psStack_a8[6].header.field_0.typePointer = 0xc;
        psStack_a8[6].header.identityHashAndFlags = 0xc;
        psStack_a8[6].header.objectSize = 0;
        psStack_a8[3].field_1 =
             *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(local_c0 + 0x10);
        sStack_98 = sysbvm_orderedOffsetTableBuilder_create(context);
        local_90 = sysbvm_orderedOffsetTableBuilder_create(context);
        ppsVar16 = &psStack_b8->assembler->firstInstruction;
        sVar25 = 0;
        while (local_a0 = *ppsVar16,
              local_a0 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
          sVar14 = sysbvm_tuple_size_encode(context,sVar25);
          psVar27 = local_a0;
          local_a0->pc = sVar14;
          _Var7 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,local_a0);
          if (_Var7) {
            uVar21 = 0;
          }
          else {
            uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
            uVar21 = 1;
            if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
              uVar21 = (ulong)(*(uint *)(uVar11 + 0xc) >> 2) | 1;
            }
          }
          sVar14 = sysbvm_tuple_size_encode(context,uVar21 + sVar25);
          local_a0->endPC = sVar14;
          sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
                    (context,sStack_98,(uint32_t)sVar25,local_a0->sourcePosition);
          sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
                    (context,local_90,(uint32_t)sVar25,local_a0->sourceEnvironment);
          sVar25 = uVar21 + sVar25;
          ppsVar16 = &local_a0->next;
        }
        sVar14 = sysbvm_byteArray_create(context,sVar25);
        psStack_a8[2].header.field_0.typePointer = sVar14;
        local_68 = sVar14 + 0x10;
        ppsVar20 = &psStack_b8->assembler->firstInstruction;
        local_60 = sVar14 + 0x11;
        lVar23 = 0;
        do {
          psVar27 = *ppsVar20;
          local_a0 = psVar27;
          if (psVar27 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
            local_c8->bytecode = (sysbvm_tuple_t)psStack_a8;
            local_c8->sourceAnalyzedDefinition = 0;
            sVar14 = sysbvm_orderedOffsetTableBuilder_finish(context,sStack_98);
            psStack_a8[4].header.field_0.typePointer = sVar14;
            sVar14 = sysbvm_orderedOffsetTableBuilder_finish(context,local_90);
            psStack_a8[4].header.identityHashAndFlags = (int)sVar14;
            psStack_a8[4].header.objectSize = (int)(sVar14 >> 0x20);
            return;
          }
          _Var7 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar27);
          if (_Var7) {
            lVar29 = 0;
          }
          else {
            uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
            if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
              uVar11 = (ulong)(*(uint *)(uVar11 + 0xc) >> 3);
            }
            else {
              uVar11 = 0;
            }
            aVar5 = psVar27[1].super.header.field_0.field_1;
            bVar9 = (byte)((ulong)aVar5 >> 4);
            bVar8 = bVar9;
            local_70 = lVar23;
            if (0x3f < bVar9) {
              sysbvm_bytecodeInterpreter_ensureTablesAreFilled();
              bVar8 = sysbvm_implicitVariableBytecodeOperandCountTable
                      [aVar5.typePointer32 >> 8 & 0xf];
              if ((uint)uVar11 < (uint)bVar8) {
                sysbvm_error_assertionFailure
                          (
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:770: assertion failure: operandCount >= implicitOperandCount"
                          );
              }
              bVar8 = ((byte)(uVar11 - bVar8 >> (bVar9 == 0xe0)) & 0xf) + bVar9;
            }
            lVar23 = local_70;
            local_78 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t **)
                       (local_68 + local_70);
            *(byte *)local_78 = bVar8;
            bVar9 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(bVar9);
            local_88 = local_60 + lVar23;
            lVar23 = 1;
            uVar21 = 0;
            local_80 = psVar27;
            for (uVar15 = 0; (uint)uVar11 * 2 != uVar15; uVar15 = uVar15 + 2) {
              uVar26 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
              if (uVar26 == 0 || (uVar26 & 0xf) != 0) {
                puVar24 = (undefined2 *)((long)local_78 + lVar23);
LAB_001479e1:
                if (bVar9 <= uVar21) {
                  sysbvm_error("Invalid missing non-destination operand.");
                }
                *puVar24 = 0xffff;
              }
              else {
                uVar26 = *(ulong *)(uVar26 + 0x10 + uVar15 * 4);
                if (uVar26 == 0) {
                  puVar24 = (undefined2 *)(local_88 + uVar15);
                  goto LAB_001479e1;
                }
                sVar14 = sysbvm_tuple_getType(context,uVar26);
                psVar27 = local_80;
                if ((sVar14 == (context->roots).functionBytecodeAssemblerInstruction) ||
                   (sVar14 == (context->roots).functionBytecodeAssemblerLabel)) {
                  uVar26 = *(ulong *)(uVar26 + 0x10);
                  if (uVar26 == 0 || (uVar26 & 0xf) != 0) {
                    sVar10 = (short)((long)uVar26 >> 4);
                  }
                  else {
                    sVar10 = (short)*(undefined8 *)(uVar26 + 0x10);
                  }
                  uVar26 = local_80->endPC;
                  if (uVar26 == 0 || (uVar26 & 0xf) != 0) {
                    sVar17 = (short)((long)uVar26 >> 4);
                  }
                  else {
                    sVar17 = (short)*(undefined8 *)(uVar26 + 0x10);
                  }
                  *(short *)(local_88 + uVar15) = sVar10 - sVar17;
                }
                else if (sVar14 == (context->roots).functionBytecodeAssemblerVectorOperand) {
                  *(ushort *)(local_88 + uVar15) =
                       (ushort)(*(uint *)(uVar26 + 0x10) >> 2) & 0xfffc |
                       (ushort)(*(uint *)(uVar26 + 0x18) >> 4);
                }
                else {
                  if (sVar14 != (context->roots).int16Type) {
                    abort();
                  }
                  *(char *)(local_88 + uVar15) = (char)(uVar26 >> 4);
                  *(char *)(local_88 + 1 + uVar15) = (char)((uint)uVar26 >> 0xc);
                }
              }
              lVar23 = lVar23 + 2;
              uVar21 = uVar21 + 1;
            }
            lVar29 = uVar15 + 1;
            lVar23 = local_70;
          }
          lVar23 = lVar23 + lVar29;
          ppsVar20 = &local_a0->next;
        } while( true );
      }
      psVar3 = psVar27->next;
      _Var7 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar27);
    } while (_Var7);
    uVar11 = psVar27[1].super.header.field_0.typePointer >> 4;
    if ((char)uVar11 == '7') {
      uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
      if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
        sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10);
      }
      else {
        sVar14 = 0;
      }
      _Var7 = sysbvm_functionBytecodeAssembler_isLocalOnlyReferenceAt(sVar14);
      if (_Var7) {
        lVar23 = *(long *)(uVar11 + 0x10);
        *(undefined8 *)(lVar23 + 0x58) = *(undefined8 *)(uVar11 + 0x18);
        *(undefined8 *)(lVar23 + 0x60) = *(undefined8 *)(uVar11 + 0x20);
        psVar12 = psVar27->previous;
        psVar27 = psVar27->next;
        ppsVar20 = &psVar12->next;
        if (psVar12 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
          ppsVar20 = local_78;
        }
        *ppsVar20 = psVar27;
        ppsVar20 = &psVar27->previous;
        if (psVar27 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
          ppsVar20 = &psVar2->lastInstruction;
        }
        *ppsVar20 = psVar12;
      }
      goto LAB_0014728f;
    }
    uVar28 = (uint)uVar11 & 0xff;
    if (uVar28 == 0x22) {
      uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
      bVar30 = uVar11 == 0;
      bVar31 = (uVar11 & 0xf) != 0;
      if (bVar31 || bVar30) {
        sVar14 = 0;
      }
      else {
        sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x18);
      }
      _Var7 = sysbvm_functionBytecodeAssembler_isLocalOnlyAlloca(sVar14);
      if (_Var7) goto LAB_001473c8;
      if (bVar31 || bVar30) {
        sVar14 = 0;
      }
      else {
        sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x18);
      }
      _Var7 = sysbvm_functionBytecodeAssembler_isLocalOnlyReferenceAt(sVar14);
      if (_Var7) {
        if (bVar31 || bVar30) {
          lVar23 = 0;
        }
        else {
          lVar23 = *(long *)(uVar11 + 0x18);
        }
        sVar14 = sysbvm_array_create(context,3);
        uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
        if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
          uVar19 = *(undefined8 *)(uVar11 + 0x10);
        }
        else {
          uVar19 = 0;
        }
        if ((sVar14 & 0xf) == 0 && sVar14 != 0) {
          *(undefined8 *)(sVar14 + 0x10) = uVar19;
          *(undefined8 *)(sVar14 + 0x18) = *(undefined8 *)(lVar23 + 0x58);
          *(undefined8 *)(sVar14 + 0x20) = *(undefined8 *)(lVar23 + 0x60);
        }
        psVar27[1].super.header.field_0.typePointer = 0x363;
        psVar27[1].super.header.identityHashAndFlags = (int)sVar14;
        psVar27[1].super.header.objectSize = (int)(sVar14 >> 0x20);
      }
    }
    else if (uVar28 == 0x24) {
      uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
      bVar30 = uVar11 == 0;
      bVar31 = (uVar11 & 0xf) != 0;
      if (bVar31 || bVar30) {
        sVar14 = 0;
      }
      else {
        sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10);
      }
      _Var7 = sysbvm_functionBytecodeAssembler_isLocalOnlyAlloca(sVar14);
      if (_Var7) {
LAB_001473c8:
        psVar27[1].super.header.field_0.typePointer = 0x213;
      }
      else {
        if (bVar31 || bVar30) {
          sVar14 = 0;
        }
        else {
          sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10);
        }
        _Var7 = sysbvm_functionBytecodeAssembler_isLocalOnlyReferenceAt(sVar14);
        if (_Var7) {
          if (bVar31 || bVar30) {
            lVar23 = 0;
          }
          else {
            lVar23 = *(long *)(uVar11 + 0x10);
          }
          sVar14 = sysbvm_array_create(context,3);
          bVar30 = (sVar14 & 0xf) == 0;
          if (bVar30 && sVar14 != 0) {
            *(undefined8 *)(sVar14 + 0x10) = *(undefined8 *)(lVar23 + 0x58);
            *(undefined8 *)(sVar14 + 0x18) = *(undefined8 *)(lVar23 + 0x60);
          }
          uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
          if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
            uVar19 = *(undefined8 *)(uVar11 + 0x18);
          }
          else {
            uVar19 = 0;
          }
          if (bVar30 && sVar14 != 0) {
            *(undefined8 *)(sVar14 + 0x20) = uVar19;
          }
          psVar27[1].super.header.field_0.typePointer = 899;
          psVar27[1].super.header.identityHashAndFlags = (int)sVar14;
          psVar27[1].super.header.objectSize = (int)(sVar14 >> 0x20);
        }
      }
    }
    else if (uVar28 == 0x30) {
      uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
      bVar30 = (uVar11 & 0xf) != 0;
      if (bVar30 || uVar11 == 0) {
        sVar14 = 0;
      }
      else {
        sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10);
      }
      _Var7 = sysbvm_functionBytecodeAssembler_isLocalOnlyAlloca(sVar14);
      if (_Var7) {
        if (bVar30 || uVar11 == 0) {
          sVar14 = 0;
        }
        else {
          sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10);
        }
        sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(context,psVar2,sVar14);
        sVar14 = sysbvm_array_create(context,2);
        uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
        if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
          uVar19 = *(undefined8 *)(uVar11 + 0x10);
        }
        else {
          uVar19 = 0;
        }
        bVar30 = (sVar14 & 0xf) == 0;
        if (bVar30 && sVar14 != 0) {
          *(undefined8 *)(sVar14 + 0x10) = uVar19;
          uVar11._0_4_ = psVar27[1].super.header.identityHashAndFlags;
          uVar11._4_4_ = psVar27[1].super.header.objectSize;
        }
        if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
          uVar19 = *(undefined8 *)(uVar11 + 0x20);
        }
        else {
          uVar19 = 0;
        }
        if (bVar30 && sVar14 != 0) {
          *(undefined8 *)(sVar14 + 0x18) = uVar19;
        }
        psVar27[1].super.header.field_0.typePointer = 0x213;
        psVar27[1].super.header.identityHashAndFlags = (int)sVar14;
        psVar27[1].super.header.objectSize = (int)(sVar14 >> 0x20);
      }
    }
    else if (uVar28 == 0x20) {
      uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
      bVar30 = (uVar11 & 0xf) != 0;
      if (bVar30 || uVar11 == 0) {
        sVar14 = 0;
      }
      else {
        sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10);
      }
      _Var7 = sysbvm_functionBytecodeAssembler_isLocalOnlyAlloca(sVar14);
      if (_Var7) {
        psVar27[1].super.header.field_0.typePointer = 0x213;
        sVar14 = sysbvm_functionBytecodeAssembler_addLiteral(context,psVar2,0);
        if (!bVar30 && uVar11 != 0) {
          *(sysbvm_tuple_t *)(uVar11 + 0x18) = sVar14;
        }
        uVar11 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
        if ((uVar11 & 0xf) == 0 && uVar11 != 0) {
          sVar14 = *(sysbvm_tuple_t *)(uVar11 + 0x10);
        }
        else {
          sVar14 = 0;
        }
        sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(context,psVar2,sVar14);
      }
    }
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition(sysbvm_context_t *context, sysbvm_functionDefinition_t *definition_)
{
    struct {
        sysbvm_functionDefinition_t *definition;
        sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t bodyResult;
        sysbvm_functionBytecode_t *bytecode;
        sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instruction;

        sysbvm_tuple_t debugSourcePositions;
        sysbvm_tuple_t debugSourceEnvironments;
    } gcFrame = {
        .definition = (sysbvm_functionDefinition_t*)definition_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.definition->sourceAnalyzedDefinition;

    gcFrame.compiler = (sysbvm_functionBytecodeDirectCompiler_t*)sysbvm_functionBytecodeDirectCompiler_create(context);
    gcFrame.compiler->assembler->sourceEnvironment = gcFrame.sourceAnalyzedDefinition->environment;
    gcFrame.compiler->assembler->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;

    {
        // Make the argument operands.
        size_t argumentCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->arguments);
        sysbvm_functionBytecodeAssembler_setArgumentCount(context, gcFrame.compiler->assembler, argumentCount);
        for(size_t i = 0; i < argumentCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->arguments, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->arguments, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }

        // Make the binding operands.
        size_t captureCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->captures);
        sysbvm_functionBytecodeAssembler_setCaptureCount(context, gcFrame.compiler->assembler, captureCount);
        for(size_t i = 0; i < captureCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->captures, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->captures, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }
    }

    // Compile the body.
    gcFrame.bodyResult = gcFrame.sourceAnalyzedDefinition->bodyNode
        ? sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, gcFrame.sourceAnalyzedDefinition->bodyNode)
        : sysbvm_functionBytecodeAssembler_addLiteral(context, gcFrame.compiler->assembler, SYSBVM_VOID_TUPLE);

    if(gcFrame.bodyResult)
        sysbvm_functionBytecodeAssembler_return(context, gcFrame.compiler->assembler, gcFrame.bodyResult);

    // Perform some optimizations.
    sysbvm_functionBytecodeAssembler_optimizeJumps(context, gcFrame.compiler->assembler);
    sysbvm_functionBytecodeAssembler_optimizeTemporaries(context, gcFrame.compiler->assembler);
    
    // Assemble the instructions.
    gcFrame.compiler->assembler->usedTemporaryCount = sysbvm_tuple_size_encode(context, sysbvm_orderedCollection_getSize(gcFrame.compiler->assembler->temporaries));

    gcFrame.bytecode = (sysbvm_functionBytecode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionBytecodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionBytecode_t));
    gcFrame.bytecode->argumentCount = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->arguments));
    gcFrame.bytecode->captureVectorSize = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->captures));
    gcFrame.bytecode->localVectorSize = gcFrame.compiler->assembler->usedTemporaryCount;
    gcFrame.bytecode->literalVector = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->literals);

    gcFrame.bytecode->definition = (sysbvm_tuple_t)gcFrame.definition;

    gcFrame.bytecode->arguments = gcFrame.sourceAnalyzedDefinition->arguments;
    gcFrame.bytecode->captures = gcFrame.sourceAnalyzedDefinition->captures;
    gcFrame.bytecode->temporaryTypes = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->temporaryTypes);

    gcFrame.bytecode->jittedCode = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    gcFrame.bytecode->jittedCodeTrampoline = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    // Tables for the debug information.
    gcFrame.bytecode->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;
    gcFrame.debugSourcePositions = sysbvm_orderedOffsetTableBuilder_create(context);
    gcFrame.debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_create(context);

    // Assemble the instructions.
    size_t instructionsOffset = 0;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
    {
        size_t pc = instructionsOffset;
        gcFrame.instruction->pc = sysbvm_tuple_size_encode(context, instructionsOffset);
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_computeAssembledSize(context, gcFrame.instruction);
        gcFrame.instruction->endPC = sysbvm_tuple_size_encode(context, instructionsOffset);

        // Add the debug annotations.
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourcePositions, (uint32_t)pc, gcFrame.instruction->sourcePosition);
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourceEnvironments, (uint32_t)pc, gcFrame.instruction->sourceEnvironment);
    }

    gcFrame.bytecode->instructions = sysbvm_byteArray_create(context, instructionsOffset);
    instructionsOffset = 0;
    uint8_t *destInstructions = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(gcFrame.bytecode->instructions)->bytes;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_assembleInto(context, gcFrame.instruction, destInstructions + instructionsOffset);

    // Finish by installing it on the definition.
    gcFrame.definition->bytecode = (sysbvm_tuple_t)gcFrame.bytecode;
    gcFrame.definition->sourceAnalyzedDefinition = SYSBVM_NULL_TUPLE;

    gcFrame.bytecode->debugSourcePositions = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourcePositions);
    gcFrame.bytecode->debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourceEnvironments);
}